

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_number.c
# Opt level: O1

void print_number_should_print_positive_reals(void)

{
  assert_print_number("0.123",0.123);
  assert_print_number("1e-09",1e-09);
  assert_print_number("1000000000000",1000000000000.0);
  assert_print_number("1.23e+129",1.23e+129);
  assert_print_number("1.23e-126",1.23e-126);
  assert_print_number("3.1415926535897931",3.141592653589793);
  return;
}

Assistant:

static void print_number_should_print_positive_reals(void)
{
    assert_print_number("0.123", 0.123);
    assert_print_number("1e-09", 10e-10);
    assert_print_number("1000000000000", 10e11);
    assert_print_number("1.23e+129", 123e+127);
    assert_print_number("1.23e-126", 123e-128);
    assert_print_number("3.1415926535897931", 3.1415926535897931);
}